

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Impl *pIVar4;
  Impl *pIVar5;
  Impl *pIVar6;
  DatabaseInterface *pDVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  Impl *this_00;
  undefined8 *puVar15;
  void *__dest;
  iterator iVar16;
  ulong size;
  void **ppvVar17;
  VkPipelineVertexInputDivisorStateCreateInfoKHR *ci;
  long *in_FS_OFFSET;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  void *local_58;
  void *local_50;
  DynamicStateInfo *local_48;
  _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  void **local_38;
  
  local_58 = (void *)0x0;
  this_00 = (Impl *)pnext_chain_skip_ignored_entries(pNext);
  if (this_00 == (Impl *)0x0) {
    local_58 = (void *)0x0;
  }
  else {
    local_40 = &(this->ycbcr_conversions)._M_h;
    ppvVar17 = &local_58;
    local_38 = out_pnext;
    do {
      uVar1 = *(uint *)&(this_00->allocator).impl;
      if ((int)uVar1 < 0x3b9e3cd0) {
        if ((int)uVar1 < 0x3b9cc5d1) {
          if ((int)uVar1 < 0x3b9c4cb9) {
            if ((int)uVar1 < 0x3b9b75e2) {
              if (uVar1 != 0x10) {
                if (uVar1 != 0x3b9b3762) goto LAB_0014fcf4;
                goto LAB_0014f9e5;
              }
              local_48 = dynamic_state_info;
              puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
              if (puVar15 != (undefined8 *)0x0) {
                pIVar4 = (this_00->allocator).impl;
                pIVar5 = (this_00->temp_allocator).impl;
                pIVar6 = (this_00->ycbcr_temp_allocator).impl;
                pDVar7 = this_00->database_iface;
                puVar15[4] = this_00->module_identifier_database_iface;
                puVar15[2] = pIVar6;
                puVar15[3] = pDVar7;
                *puVar15 = pIVar4;
                puVar15[1] = pIVar5;
              }
              puVar15[1] = 0;
              if ((ulong)puVar15[3] < 4) {
LAB_0014fcbc:
                __dest = (void *)0x0;
              }
              else {
                local_50 = (void *)puVar15[4];
                size = puVar15[3] & 0xfffffffffffffffc;
                __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
                if (__dest == (void *)0x0) goto LAB_0014fcbc;
                memmove(__dest,local_50,size);
              }
              puVar15[4] = __dest;
              dynamic_state_info = local_48;
            }
            else if (uVar1 == 0x3b9b75e2) {
              puVar15 = (undefined8 *)
                        copy_pnext_struct((Impl *)pNext,(VkPipelineRenderingCreateInfoKHR *)this_00,
                                          alloc,state_flags);
            }
            else {
              if (uVar1 != 0x3b9b9908) {
                if (uVar1 != 0x3b9bd3a0) goto LAB_0014fcf4;
                goto LAB_0014f9a1;
              }
              puVar15 = (undefined8 *)
                        copy_pnext_struct((Impl *)pNext,(VkRenderPassMultiviewCreateInfo *)this_00,
                                          alloc);
            }
          }
          else {
            if (0x3b9c5870 < (int)uVar1) {
              if (uVar1 != 0x3b9c5871) {
                if (uVar1 == 0x3b9c9309) {
                  puVar15 = (undefined8 *)
                            copy_pnext_struct((Impl *)pNext,
                                              (VkRenderPassInputAttachmentAspectCreateInfo *)this_00
                                              ,alloc);
                  goto LAB_0014fc92;
                }
                if (uVar1 != 0x3b9c930b) goto LAB_0014fcf4;
              }
              goto LAB_0014f9e5;
            }
            if (uVar1 != 0x3b9c4cb9) {
              if (uVar1 != 0x3b9c5489) goto LAB_0014fcf4;
              goto LAB_0014f9a1;
            }
            puVar15 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,
                                        (VkPipelineDiscardRectangleStateCreateInfoEXT *)this_00,
                                        alloc,dynamic_state_info);
          }
        }
        else if ((int)uVar1 < 0x3b9d2b61) {
          if ((int)uVar1 < 0x3b9cf89a) {
            if (uVar1 == 0x3b9cc5d1) goto LAB_0014f9e5;
            if (uVar1 != 0x3b9cf898) goto LAB_0014fcf4;
            puVar15 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,(VkSampleLocationsInfoEXT *)this_00,alloc);
          }
          else if (uVar1 == 0x3b9cf89a) {
            puVar15 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,
                                        (VkPipelineSampleLocationsStateCreateInfoEXT *)this_00,alloc
                                        ,dynamic_state_info);
          }
          else {
            if (uVar1 == 0x3b9d0c22) goto LAB_0014f9a1;
            if (uVar1 != 0x3b9d2b60) goto LAB_0014fcf4;
            puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
            if (puVar15 != (undefined8 *)0x0) {
              uVar18 = *(undefined4 *)&(this_00->allocator).impl;
              uVar19 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
              uVar20 = *(undefined4 *)&(this_00->temp_allocator).impl;
              uVar21 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
              uVar22 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
              uVar23 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
              uVar24 = *(undefined4 *)&this_00->database_iface;
              uVar25 = *(undefined4 *)((long)&this_00->database_iface + 4);
              uVar26 = *(undefined4 *)&this_00->module_identifier_database_iface;
              uVar27 = *(undefined4 *)((long)&this_00->module_identifier_database_iface + 4);
              uVar28 = *(undefined4 *)&this_00->on_use_database_iface;
              uVar29 = *(undefined4 *)((long)&this_00->on_use_database_iface + 4);
              uVar3 = *(undefined8 *)&this_00->should_record_identifier_only;
              puVar15[6] = this_00->application_info_filter;
              puVar15[7] = uVar3;
              goto LAB_0014fc43;
            }
          }
        }
        else if ((int)uVar1 < 0x3b9dd359) {
          if (uVar1 == 0x3b9d2b61) {
            iVar16 = std::
                     _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_40,(key_type *)&this_00->ycbcr_temp_allocator);
            if (iVar16.
                super__Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
            puVar2 = *(undefined8 **)
                      ((long)iVar16.
                             super__Node_iterator_base<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_false>
                             ._M_cur + 0x10);
            puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
            if (puVar15 != (undefined8 *)0x0) {
              uVar3 = *puVar2;
              uVar8 = puVar2[1];
              uVar9 = puVar2[2];
              uVar10 = puVar2[3];
              uVar11 = puVar2[4];
              uVar12 = puVar2[5];
              uVar13 = puVar2[7];
              puVar15[6] = puVar2[6];
              puVar15[7] = uVar13;
              puVar15[4] = uVar11;
              puVar15[5] = uVar12;
              puVar15[2] = uVar9;
              puVar15[3] = uVar10;
              *puVar15 = uVar3;
              puVar15[1] = uVar8;
            }
            if (puVar2[1] != 0) {
              return false;
            }
          }
          else if (uVar1 == 0x3b9d3ee8) {
            puVar15 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,
                                        (VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *)this_00,
                                        alloc);
          }
          else {
            if (uVar1 != 0x3b9db031) goto LAB_0014fcf4;
            puVar15 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,
                                        (VkPipelineVertexInputDivisorStateCreateInfoKHR *)this_00,
                                        alloc);
          }
        }
        else {
          if (uVar1 != 0x3b9dd359) {
            if ((uVar1 != 0x3b9e1d92) && (uVar1 != 0x3b9e38e9)) goto LAB_0014fcf4;
            goto LAB_0014f9e5;
          }
          puVar15 = (undefined8 *)
                    copy_pnext_struct(this,(VkSubpassDescriptionDepthStencilResolve *)this_00,alloc)
          ;
LAB_0014fc11:
          if (puVar15 == (undefined8 *)0x0) {
            return false;
          }
        }
      }
      else if ((int)uVar1 < 0x3b9f9490) {
        if (0x3b9e7769 < (int)uVar1) {
          if ((int)uVar1 < 0x3b9f1b7a) {
            if ((uVar1 != 0x3b9e776a) && (uVar1 != 0x3b9eaa31)) {
              if (uVar1 != 0x3b9ebdb9) goto LAB_0014fcf4;
              goto LAB_0014f9a1;
            }
          }
          else if (uVar1 != 0x3b9f1b7a) {
            if (uVar1 == 0x3b9f2b18) {
LAB_0014fa14:
              puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
              if (puVar15 != (undefined8 *)0x0) {
                uVar18 = *(undefined4 *)&(this_00->allocator).impl;
                uVar19 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
                uVar20 = *(undefined4 *)&(this_00->temp_allocator).impl;
                uVar21 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
                uVar22 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
                uVar23 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
                uVar24 = *(undefined4 *)&this_00->database_iface;
                uVar25 = *(undefined4 *)((long)&this_00->database_iface + 4);
                puVar15[4] = this_00->module_identifier_database_iface;
                goto LAB_0014fc47;
              }
            }
            else {
              if (uVar1 != 0x3b9f36d0) goto LAB_0014fcf4;
              puVar15 = (undefined8 *)
                        copy_pnext_struct((Impl *)pNext,(VkPipelineLibraryCreateInfoKHR *)this_00,
                                          alloc);
            }
            goto LAB_0014fc92;
          }
          goto LAB_0014f9e5;
        }
        if ((int)uVar1 < 0x3b9e5441) {
          if (uVar1 == 0x3b9e3cd0) {
            puVar15 = (undefined8 *)
                      copy_pnext_struct(this,(VkFragmentShadingRateAttachmentInfoKHR *)this_00,alloc
                                       );
            goto LAB_0014fc11;
          }
          if (uVar1 != 0x3b9e3cd1) goto LAB_0014fcf4;
LAB_0014f9a1:
          puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
          if (puVar15 != (undefined8 *)0x0) {
            uVar18 = *(undefined4 *)&(this_00->allocator).impl;
            uVar19 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
            uVar20 = *(undefined4 *)&(this_00->temp_allocator).impl;
            uVar21 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
            uVar22 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
            uVar23 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
            uVar24 = *(undefined4 *)&this_00->database_iface;
            uVar25 = *(undefined4 *)((long)&this_00->database_iface + 4);
LAB_0014fc47:
            *(undefined4 *)(puVar15 + 2) = uVar22;
            *(undefined4 *)((long)puVar15 + 0x14) = uVar23;
            *(undefined4 *)(puVar15 + 3) = uVar24;
            *(undefined4 *)((long)puVar15 + 0x1c) = uVar25;
            goto LAB_0014fc4b;
          }
        }
        else if (uVar1 == 0x3b9e5441) {
          puVar15 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,(VkRenderingAttachmentLocationInfoKHR *)this_00,
                                      alloc);
        }
        else {
          if (uVar1 != 0x3b9e5442) {
            if (uVar1 != 0x3b9e7769) goto LAB_0014fcf4;
            goto LAB_0014f9e5;
          }
          puVar15 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,
                                      (VkRenderingInputAttachmentIndexInfoKHR *)this_00,alloc);
        }
      }
      else if ((int)uVar1 < 0x3ba09a49) {
        if ((int)uVar1 < 0x3ba0251a) {
          if (uVar1 == 0x3b9f9490) {
            puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x30,0x10);
            if (puVar15 == (undefined8 *)0x0) goto LAB_0014fc92;
            uVar18 = *(undefined4 *)&(this_00->allocator).impl;
            uVar19 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
            uVar20 = *(undefined4 *)&(this_00->temp_allocator).impl;
            uVar21 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
            uVar22 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
            uVar23 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
            uVar24 = *(undefined4 *)&this_00->database_iface;
            uVar25 = *(undefined4 *)((long)&this_00->database_iface + 4);
            uVar26 = *(undefined4 *)&this_00->module_identifier_database_iface;
            uVar27 = *(undefined4 *)((long)&this_00->module_identifier_database_iface + 4);
            uVar28 = *(undefined4 *)&this_00->on_use_database_iface;
            uVar29 = *(undefined4 *)((long)&this_00->on_use_database_iface + 4);
LAB_0014fc43:
            *(undefined4 *)(puVar15 + 4) = uVar26;
            *(undefined4 *)((long)puVar15 + 0x24) = uVar27;
            *(undefined4 *)(puVar15 + 5) = uVar28;
            *(undefined4 *)((long)puVar15 + 0x2c) = uVar29;
            goto LAB_0014fc47;
          }
          if (uVar1 != 0x3b9fac02) goto LAB_0014fcf4;
        }
        else {
          if (uVar1 == 0x3ba0251a) {
            puVar15 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,
                                        (VkMutableDescriptorTypeCreateInfoEXT *)this_00,alloc);
            goto LAB_0014fc92;
          }
          if ((uVar1 != 0x3ba034b9) && (uVar1 != 0x3ba086c2)) {
LAB_0014fcf4:
            if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
              bVar14 = Internal::log_thread_callback
                                 (LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n",(ulong)uVar1);
              if (bVar14) {
                return false;
              }
              copy_pnext_chain(this_00);
            }
            return false;
          }
        }
LAB_0014f9e5:
        puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x18,0x10);
        if (puVar15 != (undefined8 *)0x0) {
          uVar18 = *(undefined4 *)&(this_00->allocator).impl;
          uVar19 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
          uVar20 = *(undefined4 *)&(this_00->temp_allocator).impl;
          uVar21 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
          puVar15[2] = (this_00->ycbcr_temp_allocator).impl;
LAB_0014fc4b:
          *(undefined4 *)puVar15 = uVar18;
          *(undefined4 *)((long)puVar15 + 4) = uVar19;
          *(undefined4 *)(puVar15 + 1) = uVar20;
          *(undefined4 *)((long)puVar15 + 0xc) = uVar21;
        }
      }
      else if ((int)uVar1 < 0x3ba1d6b2) {
        if (uVar1 != 0x3ba09a49) {
          if (uVar1 == 0x3ba10f79) goto LAB_0014fa14;
          if (uVar1 != 0x3ba1c711) goto LAB_0014fcf4;
          goto LAB_0014f9e5;
        }
        puVar15 = (undefined8 *)
                  copy_pnext_struct((Impl *)pNext,(VkPipelineColorWriteCreateInfoEXT *)this_00,alloc
                                    ,dynamic_state_info);
      }
      else if (uVar1 == 0x3ba1d6b2) {
        puVar15 = (undefined8 *)
                  copy_pnext_struct((Impl *)pNext,
                                    (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)this_00,
                                    alloc);
      }
      else if (uVar1 == 0x3ba1f5f5) {
        puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x18,0x10);
        if (puVar15 != (undefined8 *)0x0) {
          pIVar4 = (this_00->allocator).impl;
          pIVar5 = (this_00->temp_allocator).impl;
          puVar15[2] = (this_00->ycbcr_temp_allocator).impl;
          *puVar15 = pIVar4;
          puVar15[1] = pIVar5;
        }
        *(uint *)(puVar15 + 2) = *(uint *)(puVar15 + 2) & 0x7ffffc3f;
      }
      else {
        if (uVar1 != 0x3ba3ab71) goto LAB_0014fcf4;
        puVar15 = (undefined8 *)
                  copy_pnext_struct((Impl *)pNext,
                                    (VkPipelineViewportDepthClampControlCreateInfoEXT *)this_00,
                                    alloc,dynamic_state_info);
      }
LAB_0014fc92:
      *ppvVar17 = puVar15;
      pNext = (this_00->temp_allocator).impl;
      puVar15[1] = 0;
      ppvVar17 = (void **)(puVar15 + 1);
      this_00 = (Impl *)pnext_chain_skip_ignored_entries(pNext);
      out_pnext = local_38;
    } while (this_00 != (Impl *)0x0);
  }
  *out_pnext = local_58;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain(const void *pNext, ScratchAllocator &alloc, const void **out_pnext,
                                           const DynamicStateInfo *dynamic_state_info,
                                           VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
		{
			auto ci = static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			auto *ci = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);
			auto *resolve = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!resolve)
				return false;
			*ppNext = resolve;
			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			auto *ci = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);
			auto *rate = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!rate)
				return false;
			*ppNext = rate;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, state_flags));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			auto *ci = static_cast<const VkMemoryBarrier2KHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		{
			// Special case. Instead of serializing the YCbCr object link, serialize the original create info.
			// Reduces excessive churn for supporting an extremely niche object type.
			auto *ci = static_cast<const VkSamplerYcbcrConversionInfo *>(pNext);
			auto ycbcr = ycbcr_conversions.find(ci->conversion);
			if (ycbcr == ycbcr_conversions.end())
				return false;

			VkSamplerYcbcrConversionCreateInfo *new_create_info;
			if (!copy_ycbcr_conversion(ycbcr->second, alloc, &new_create_info))
				return false;

			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_create_info);
			break;
		}

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkShaderModuleCreateInfo *>(pNext);
			VkShaderModuleCreateInfo *new_module = nullptr;
			if (!copy_shader_module(ci, alloc, true, &new_module))
				return false;
			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_module);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext);
			auto *flags2 = static_cast<VkPipelineCreateFlags2CreateInfoKHR *>(copy_pnext_struct_simple(ci, alloc));
			flags2->flags = normalize_pipeline_creation_flags(flags2->flags);
			*ppNext = reinterpret_cast<VkBaseInStructure *>(flags2);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
		{
			auto *ci = static_cast<const VkRenderPassCreationControlEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
		{
			auto *ci = static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			auto *ci = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
		{
			auto *ci = static_cast<const VkSampleLocationsInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = new_pnext.pNext;
	return true;
}